

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ninjato.cpp
# Opt level: O0

void __thiscall Ninjato::Ninjato(Ninjato *this,string *n,int t,int spT)

{
  int spT_00;
  int t_00;
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  int local_20;
  int local_1c;
  int spT_local;
  int t_local;
  string *n_local;
  Ninjato *this_local;
  
  local_20 = spT;
  local_1c = t;
  _spT_local = n;
  n_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)n);
  t_00 = local_1c;
  spT_00 = local_20;
  std::operator+((char *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Green Card - Item. Katana: ");
  Item::Item(&this->super_Item,(string *)local_40,t_00,spT_00,4,3,3,3,2,2,4,local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_40);
  (this->super_Item).super_GreenCard.super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_0012b560
  ;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->cardText);
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  this->cost = 4;
  this->tapped = false;
  this->attackBonus = 3;
  this->defenseBonus = 3;
  this->minimumHonor = 3;
  std::operator+((char *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Green Card - Item. Katana: ");
  std::__cxx11::string::operator=((string *)&this->cardText,local_90);
  std::__cxx11::string::~string(local_90);
  this->effectBonus = 2;
  this->effectCost = 2;
  this->durability = 4;
  return;
}

Assistant:

Ninjato::Ninjato(string n, int t, int spT) : Item{n, t, spT, 4, 3, 3, 3, 2, 2, 4, "Green Card - Item. Katana: " + n}
{
    name = n;
    cost = 4;
    tapped = false;

    attackBonus = 3;
    defenseBonus = 3;
    minimumHonor = 3;
    cardText = "Green Card - Item. Katana: " + name;

    effectBonus = 2;
    effectCost = 2;
    durability = 4;
}